

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::NeuralNetworkImageScaler::ByteSizeLong(NeuralNetworkImageScaler *this)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  size_t sVar3;
  undefined4 in_EDX;
  uint uVar4;
  
  sVar2 = 0;
  if (this->graybias_ != 0.0) {
    sVar2 = 6;
  }
  if (NAN(this->graybias_)) {
    sVar2 = 6;
  }
  auVar1._4_4_ = -(uint)(this->bluebias_ != 0.0);
  auVar1._0_4_ = -(uint)(this->channelscale_ != 0.0);
  auVar1._8_4_ = -(uint)(this->greenbias_ != 0.0);
  auVar1._12_4_ = -(uint)(this->redbias_ != 0.0);
  uVar4 = movmskps(in_EDX,auVar1);
  sVar3 = sVar2 + 5;
  if ((uVar4 & 1) == 0) {
    sVar3 = sVar2;
  }
  sVar2 = sVar3 + 6;
  if ((uVar4 & 2) == 0) {
    sVar2 = sVar3;
  }
  sVar3 = sVar2 + 6;
  if ((uVar4 & 4) == 0) {
    sVar3 = sVar2;
  }
  sVar2 = sVar3 + 6;
  if ((uVar4 & 8) == 0) {
    sVar2 = sVar3;
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t NeuralNetworkImageScaler::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.NeuralNetworkImageScaler)
  size_t total_size = 0;

  // float grayBias = 30;
  if (this->graybias() != 0) {
    total_size += 2 + 4;
  }

  // float channelScale = 10;
  if (this->channelscale() != 0) {
    total_size += 1 + 4;
  }

  // float blueBias = 20;
  if (this->bluebias() != 0) {
    total_size += 2 + 4;
  }

  // float greenBias = 21;
  if (this->greenbias() != 0) {
    total_size += 2 + 4;
  }

  // float redBias = 22;
  if (this->redbias() != 0) {
    total_size += 2 + 4;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}